

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_extensions.cpp
# Opt level: O3

char * ONX_ModelTest::ResultToString(Result result)

{
  if (result < (Pass|Errors)) {
    return &DAT_006ac9b0 + *(int *)(&DAT_006ac9b0 + (ulong)result * 4);
  }
  ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_extensions.cpp"
             ,0xfac,"","Invalid result parameter.");
  return "Invalid result parameter";
}

Assistant:

const char* ONX_ModelTest::ResultToString(ONX_ModelTest::Result result)
{
  switch (result)
  {
  case ONX_ModelTest::Result::Unset:
    return "Unset";
    break;
  case ONX_ModelTest::Result::Fail:
    return "Fail";
    break;
  case ONX_ModelTest::Result::Errors:
    return "Errors";
    break;
  case ONX_ModelTest::Result::Warnings:
    return "Warnings";
    break;
  case ONX_ModelTest::Result::Pass:
    return "Pass";
    break;
  case ONX_ModelTest::Result::Skip:
    return "Skip";
    break;
  default:
    break;
  }

  ON_ERROR("Invalid result parameter.");
  return "Invalid result parameter";
}